

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clocks.hh
# Opt level: O1

int tchecker::lexical_cmp(clock_constraint_t *c1,clock_constraint_t *c2)

{
  int iVar1;
  bool bVar2;
  
  if (c1->_id1 == c2->_id1) {
    if (c1->_id2 == c2->_id2) {
      if (c1->_cmp == c2->_cmp) {
        iVar1 = 0;
        if (c1->_value != c2->_value) {
          iVar1 = (uint)(c2->_value <= c1->_value) * 2 + -1;
        }
        return iVar1;
      }
      bVar2 = c1->_cmp == LT;
    }
    else {
      bVar2 = c1->_id2 < c2->_id2;
    }
  }
  else {
    bVar2 = c1->_id1 < c2->_id2;
  }
  return -(uint)bVar2 | 1;
}

Assistant:

inline constexpr tchecker::clock_id_t id1() const { return _id1; }